

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMReadWriteGraphBuilder.h
# Opt level: O1

ReadWriteGraph * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::build(LLVMReadWriteGraphBuilder *this)

{
  long lVar1;
  DGCallGraphImpl *this_00;
  Function *f;
  RWSubgraph *pRVar2;
  StringRef SVar3;
  CallGraph CG;
  _Head_base<0UL,_dg::llvmdg::CallGraphImpl_*,_false> local_20;
  
  if (*(int *)(this->PTA + 0x70) == 3) {
    GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildGlobals
              (&this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>);
    GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildAllFuns
              (&this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>);
  }
  else {
    lVar1 = *(long *)(*(long *)(this->PTA + 0x80) + 0x38);
    this_00 = (DGCallGraphImpl *)operator_new(0x40);
    llvmdg::DGCallGraphImpl::DGCallGraphImpl
              (this_00,(GenericCallGraph<dg::pta::PSNode_*> *)(lVar1 + 0x48));
    local_20._M_head_impl = (CallGraphImpl *)this_00;
    GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildGlobals
              (&this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>);
    GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildFunsFromCG
              (&this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>,
               (CallGraph *)&local_20);
    if ((DGCallGraphImpl *)local_20._M_head_impl != (DGCallGraphImpl *)0x0) {
      (*((CallGraphImpl *)&(local_20._M_head_impl)->_vptr_CallGraphImpl)->_vptr_CallGraphImpl[1])();
    }
  }
  SVar3.Length = *(size_t *)this->_options;
  SVar3.Data = (char *)(this->
                       super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>).
                       _module;
  f = (Function *)llvm::Module::getFunction(SVar3);
  pRVar2 = GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::getSubgraph
                     (&this->
                       super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>,f
                     );
  (this->graph)._entry = pRVar2;
  return &this->graph;
}

Assistant:

ReadWriteGraph &&build() {
        // FIXME: this is a bit of a hack
        if (!PTA->getOptions().isSVF()) {
            auto *dgpta = static_cast<DGLLVMPointerAnalysis *>(PTA);
            llvmdg::CallGraph CG(dgpta->getPTA()->getPG()->getCallGraph());
            buildFromLLVM(&CG);
        } else {
            buildFromLLVM();
        }

        auto *entry = getModule()->getFunction(_options.entryFunction);
        assert(entry && "Did not find the entry function");
        graph.setEntry(getSubgraph(entry));

        return std::move(graph);
    }